

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  int iVar1;
  
  iVar1 = this->ItemsCount;
  if (-1 < iVar1) {
    if ((iVar1 != 0x7fffffff) && (-1 < this->DisplayStart)) {
      SetCursorPosYAndSetupForPrevLine
                ((float)(iVar1 - this->ItemsFrozen) * this->ItemsHeight + this->StartPosY,
                 this->ItemsHeight);
    }
    this->ItemsCount = -1;
    this->StepNo = 3;
  }
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    if (ItemsCount < 0) // Already ended
        return;

    // In theory here we should assert that ImGui::GetCursorPosY() == StartPosY + DisplayEnd * ItemsHeight, but it feels saner to just seek at the end and not assert/crash the user.
    if (ItemsCount < INT_MAX && DisplayStart >= 0)
        SetCursorPosYAndSetupForPrevLine(StartPosY + (ItemsCount - ItemsFrozen) * ItemsHeight, ItemsHeight);
    ItemsCount = -1;
    StepNo = 3;
}